

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>_>
::UseKeyAndValueFromEntry
          (Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block>_>
           *this)

{
  value_type *pvVar1;
  ValueMapEntryAccessorType *other;
  
  (*(this->entry_->super_MessageLite)._vptr_MessageLite[0xd])();
  std::__cxx11::string::_M_assign((string *)&this->key_);
  pvVar1 = Map<std::__cxx11::string,CoreML::Specification::MILSpec::Block>::InnerMap::
           operator[]<std::__cxx11::string&>((InnerMap *)this->map_,&this->key_);
  this->value_ptr_ = (Block *)(pvVar1 + 0x20);
  other = mutable_value(this->entry_);
  CoreML::Specification::MILSpec::Block::Swap(this->value_ptr_,other);
  return;
}

Assistant:

void UseKeyAndValueFromEntry() {
      // Update key_ in case we need it later (because key() is called).
      // This is potentially inefficient, especially if the key is
      // expensive to copy (e.g., a long string), but this is a cold
      // path, so it's not a big deal.
      key_ = entry_->key();
      value_ptr_ = &(*map_)[key_];
      ValueMover::Move(entry_->mutable_value(), value_ptr_);
    }